

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O1

void bmpmask32toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image,OPJ_UINT32 redMask,
                     OPJ_UINT32 greenMask,OPJ_UINT32 blueMask,OPJ_UINT32 alphaMask)

{
  long lVar1;
  uint uVar2;
  opj_image_comp_t *poVar3;
  OPJ_INT32 *pOVar4;
  OPJ_INT32 *pOVar5;
  OPJ_INT32 *pOVar6;
  ulong uVar7;
  int iVar8;
  OPJ_UINT32 OVar9;
  OPJ_UINT32 OVar10;
  int iVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  OPJ_UINT32 OVar15;
  OPJ_UINT8 *pOVar16;
  byte bVar17;
  OPJ_UINT32 OVar18;
  ulong uVar19;
  OPJ_UINT32 OVar20;
  byte bVar21;
  uint uVar22;
  
  bVar17 = 0;
  bVar21 = 0;
  OVar20 = 0;
  if (redMask != 0) {
    OVar20 = 0;
    OVar9 = redMask;
    bVar21 = 0;
    if ((redMask & 1) == 0) {
      bVar21 = 0;
      OVar15 = redMask;
      do {
        OVar9 = OVar15 >> 1;
        bVar21 = bVar21 + 1;
        uVar2 = OVar15 & 2;
        OVar15 = OVar9;
      } while (uVar2 == 0);
    }
    if ((OVar9 & 1) != 0) {
      OVar20 = 0;
      uVar19 = (ulong)OVar9;
      do {
        uVar19 = uVar19 >> 1;
        OVar20 = OVar20 + 1;
        uVar2 = OVar9 & 2;
        OVar9 = (OPJ_UINT32)uVar19;
      } while (uVar2 != 0);
    }
  }
  OVar9 = 0;
  if (greenMask != 0) {
    OVar9 = 0;
    bVar17 = 0;
    uVar2 = greenMask & 1;
    uVar14 = greenMask;
    while (uVar2 == 0) {
      bVar17 = bVar17 + 1;
      uVar2 = uVar14 & 2;
      uVar14 = uVar14 >> 1;
    }
    if ((uVar14 & 1) != 0) {
      OVar9 = 0;
      uVar19 = (ulong)uVar14;
      do {
        uVar19 = uVar19 >> 1;
        OVar9 = OVar9 + 1;
        uVar2 = uVar14 & 2;
        uVar14 = (uint)uVar19;
      } while (uVar2 != 0);
    }
  }
  bVar12 = 0;
  bVar13 = 0;
  OVar15 = 0;
  if (blueMask != 0) {
    OVar15 = 0;
    OVar10 = blueMask;
    bVar13 = 0;
    if ((blueMask & 1) == 0) {
      bVar13 = 0;
      OVar18 = blueMask;
      do {
        OVar10 = OVar18 >> 1;
        bVar13 = bVar13 + 1;
        uVar2 = OVar18 & 2;
        OVar18 = OVar10;
      } while (uVar2 == 0);
    }
    if ((OVar10 & 1) != 0) {
      OVar15 = 0;
      uVar19 = (ulong)OVar10;
      do {
        uVar19 = uVar19 >> 1;
        OVar15 = OVar15 + 1;
        uVar2 = OVar10 & 2;
        OVar10 = (OPJ_UINT32)uVar19;
      } while (uVar2 != 0);
    }
  }
  poVar3 = image->comps;
  uVar2 = image->numcomps;
  OVar10 = 0;
  if (alphaMask != 0) {
    OVar10 = 0;
    uVar19 = (ulong)alphaMask;
    bVar12 = 0;
    if ((alphaMask & 1) == 0) {
      bVar12 = 0;
      uVar19 = (ulong)alphaMask;
      OVar18 = alphaMask;
      do {
        uVar19 = uVar19 >> 1;
        bVar12 = bVar12 + 1;
        uVar14 = OVar18 & 2;
        OVar18 = (OPJ_UINT32)uVar19;
      } while (uVar14 == 0);
    }
    if ((uVar19 & 1) != 0) {
      OVar10 = 0;
      do {
        OVar10 = OVar10 + 1;
        uVar7 = uVar19 & 2;
        uVar19 = uVar19 >> 1;
      } while (uVar7 != 0);
    }
  }
  uVar14 = poVar3->w;
  OVar18 = poVar3->h;
  poVar3->bpp = OVar20;
  poVar3->prec = OVar20;
  poVar3[1].bpp = OVar9;
  poVar3[1].prec = OVar9;
  poVar3[2].bpp = OVar15;
  poVar3[2].prec = OVar15;
  if (3 < uVar2) {
    poVar3[3].bpp = OVar10;
    poVar3[3].prec = OVar10;
  }
  if (OVar18 != 0) {
    pOVar16 = pData + (OVar18 - 1) * stride;
    iVar11 = 0;
    OVar20 = 0;
    do {
      if ((ulong)uVar14 != 0) {
        lVar1 = (long)iVar11 * 4;
        pOVar4 = poVar3->data;
        pOVar5 = poVar3[1].data;
        pOVar6 = poVar3[2].data;
        iVar11 = iVar11 + uVar14;
        uVar19 = 0;
        do {
          iVar8 = (int)uVar19;
          uVar22 = CONCAT13(pOVar16[iVar8 + 3],
                            CONCAT12(pOVar16[iVar8 + 2],
                                     CONCAT11(pOVar16[iVar8 + 1],pOVar16[uVar19 & 0xffffffff])));
          *(uint *)((long)pOVar4 + uVar19 + lVar1) = (uVar22 & redMask) >> (bVar21 & 0x1f);
          *(uint *)((long)pOVar5 + uVar19 + lVar1) = (uVar22 & greenMask) >> (bVar17 & 0x1f);
          *(uint *)((long)pOVar6 + uVar19 + lVar1) = (uVar22 & blueMask) >> (bVar13 & 0x1f);
          if (3 < uVar2) {
            *(uint *)((long)poVar3[3].data + uVar19 + lVar1) =
                 (uVar22 & alphaMask) >> (bVar12 & 0x1f);
          }
          uVar19 = uVar19 + 4;
        } while ((ulong)uVar14 * 4 - uVar19 != 0);
      }
      pOVar16 = pOVar16 + -(ulong)stride;
      OVar20 = OVar20 + 1;
    } while (OVar20 != OVar18);
  }
  return;
}

Assistant:

static void bmpmask32toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                             opj_image_t* image, OPJ_UINT32 redMask, OPJ_UINT32 greenMask,
                             OPJ_UINT32 blueMask, OPJ_UINT32 alphaMask)
{
    int index;
    OPJ_UINT32 width, height;
    OPJ_UINT32 x, y;
    const OPJ_UINT8 *pSrc = NULL;
    OPJ_BOOL hasAlpha;
    OPJ_UINT32 redShift,   redPrec;
    OPJ_UINT32 greenShift, greenPrec;
    OPJ_UINT32 blueShift,  bluePrec;
    OPJ_UINT32 alphaShift, alphaPrec;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    hasAlpha = image->numcomps > 3U;

    bmp_mask_get_shift_and_prec(redMask,   &redShift,   &redPrec);
    bmp_mask_get_shift_and_prec(greenMask, &greenShift, &greenPrec);
    bmp_mask_get_shift_and_prec(blueMask,  &blueShift,  &bluePrec);
    bmp_mask_get_shift_and_prec(alphaMask, &alphaShift, &alphaPrec);

    image->comps[0].bpp = redPrec;
    image->comps[0].prec = redPrec;
    image->comps[1].bpp = greenPrec;
    image->comps[1].prec = greenPrec;
    image->comps[2].bpp = bluePrec;
    image->comps[2].prec = bluePrec;
    if (hasAlpha) {
        image->comps[3].bpp = alphaPrec;
        image->comps[3].prec = alphaPrec;
    }

    index = 0;
    pSrc = pData + (height - 1U) * stride;
    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            OPJ_UINT32 value = 0U;

            value |= ((OPJ_UINT32)pSrc[4 * x + 0]) <<  0;
            value |= ((OPJ_UINT32)pSrc[4 * x + 1]) <<  8;
            value |= ((OPJ_UINT32)pSrc[4 * x + 2]) << 16;
            value |= ((OPJ_UINT32)pSrc[4 * x + 3]) << 24;

            image->comps[0].data[index] = (OPJ_INT32)((value & redMask)   >>
                                          redShift);   /* R */
            image->comps[1].data[index] = (OPJ_INT32)((value & greenMask) >>
                                          greenShift); /* G */
            image->comps[2].data[index] = (OPJ_INT32)((value & blueMask)  >>
                                          blueShift);  /* B */
            if (hasAlpha) {
                image->comps[3].data[index] = (OPJ_INT32)((value & alphaMask)  >>
                                              alphaShift);  /* A */
            }
            index++;
        }
        pSrc -= stride;
    }
}